

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QTtfGlyph>::emplace<QTtfGlyph_const&>
          (QMovableArrayOps<QTtfGlyph> *this,qsizetype i,QTtfGlyph *args)

{
  QTtfGlyph **ppQVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_80;
  QTtfGlyph tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.d;
  if ((pDVar4 != (Data *)0x0) &&
     ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size == i) {
      qVar5 = QArrayDataPointer<QTtfGlyph>::freeSpaceAtEnd((QArrayDataPointer<QTtfGlyph> *)this);
      if (qVar5 == 0) goto LAB_00442569;
      QTtfGlyph::QTtfGlyph
                ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr +
                 (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size,
                 args);
LAB_00442658:
      pqVar2 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_00442617;
    }
LAB_00442569:
    if (i == 0) {
      qVar5 = QArrayDataPointer<QTtfGlyph>::freeSpaceAtBegin((QArrayDataPointer<QTtfGlyph> *)this);
      if (qVar5 != 0) {
        QTtfGlyph::QTtfGlyph
                  ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr
                   + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_00442658;
      }
    }
  }
  tmp.data.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp.data.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp.data.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  tmp._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTtfGlyph::QTtfGlyph(&tmp,args);
  bVar6 = (this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size != 0;
  QArrayDataPointer<QTtfGlyph>::detachAndGrow
            ((QArrayDataPointer<QTtfGlyph> *)this,(uint)(i == 0 && bVar6),1,(QTtfGlyph **)0x0,
             (QArrayDataPointer<QTtfGlyph> *)0x0);
  if (i == 0 && bVar6) {
    QTtfGlyph::QTtfGlyph
              ((this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr + -1
               ,&tmp);
    ppQVar1 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QTtfGlyph>).super_QArrayDataPointer<QTtfGlyph>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QTtfGlyph> *)this,i,1);
    QTtfGlyph::QTtfGlyph(local_80.displaceFrom,&tmp);
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&tmp.data.d);
LAB_00442617:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }